

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

QString * LdConfigDirWrapper::translateGuardFlag(QString *__return_storage_ptr__,DWORD flags)

{
  DWORD flags_local;
  
  if ((flags & 0x100) == 0) {
    if ((flags & 0x200) == 0) {
      if ((flags & 0x400) == 0) {
        if ((flags & 0x800) == 0) {
          if ((flags & 0x1000) == 0) {
            if ((flags & 0x2000) == 0) {
              if ((flags & 0x4000) == 0) {
                if ((flags & 0x8000) == 0) {
                  if ((flags & 0x10000) == 0) {
                    if ((flags & 0x20000) == 0) {
                      if ((flags & 0x40000) == 0) {
                        if ((flags & 0x80000) == 0) {
                          if ((flags & 0x100000) == 0) {
                            QString::QString(__return_storage_ptr__,"");
                          }
                          else {
                            QString::QString(__return_storage_ptr__,"RETPOLINE_PRESENT");
                          }
                        }
                        else {
                          QString::QString(__return_storage_ptr__,"RF_STRICT");
                        }
                      }
                      else {
                        QString::QString(__return_storage_ptr__,"RF_ENABLE");
                      }
                    }
                    else {
                      QString::QString(__return_storage_ptr__,"RF_INSTRUMENTED");
                    }
                  }
                  else {
                    QString::QString(__return_storage_ptr__,"CF_LONGJUMP_TABLE_PRESENT");
                  }
                }
                else {
                  QString::QString(__return_storage_ptr__,"CF_ENABLE_EXPORT_SUPPRESSION");
                }
              }
              else {
                QString::QString(__return_storage_ptr__,"CF_EXPORT_SUPPRESSION_INFO_PRESENT");
              }
            }
            else {
              QString::QString(__return_storage_ptr__,"DELAYLOAD_IAT_IN_ITS_OWN_SECTION");
            }
          }
          else {
            QString::QString(__return_storage_ptr__,"PROTECT_DELAYLOAD_IAT");
          }
        }
        else {
          QString::QString(__return_storage_ptr__,"SECURITY_COOKIE_UNUSED");
        }
      }
      else {
        QString::QString(__return_storage_ptr__,"CF_FUNCTION_TABLE_PRESENT");
      }
    }
    else {
      QString::QString(__return_storage_ptr__,"CFW_INSTRUMENTED");
    }
  }
  else {
    QString::QString(__return_storage_ptr__,"CF_INSTRUMENTED");
  }
  return __return_storage_ptr__;
}

Assistant:

QString LdConfigDirWrapper::translateGuardFlag(DWORD flags)
{
    if (flags & IMAGE_GUARD_CF_INSTRUMENTED) {
        return ("CF_INSTRUMENTED");
    }
    if (flags & IMAGE_GUARD_CFW_INSTRUMENTED) {
        return ("CFW_INSTRUMENTED");
    }
    if (flags & IMAGE_GUARD_CF_FUNCTION_TABLE_PRESENT) {
        return ("CF_FUNCTION_TABLE_PRESENT");
    } 
    if (flags & IMAGE_GUARD_SECURITY_COOKIE_UNUSED) {
        return ("SECURITY_COOKIE_UNUSED");
    } 
    if (flags & IMAGE_GUARD_PROTECT_DELAYLOAD_IAT) {
        return ("PROTECT_DELAYLOAD_IAT");
    } 
    if (flags & IMAGE_GUARD_DELAYLOAD_IAT_IN_ITS_OWN_SECTION) {
        return ("DELAYLOAD_IAT_IN_ITS_OWN_SECTION");
    } 
    if (flags & IMAGE_GUARD_CF_EXPORT_SUPPRESSION_INFO_PRESENT) {
        return ("CF_EXPORT_SUPPRESSION_INFO_PRESENT");
    }
    if (flags & IMAGE_GUARD_CF_ENABLE_EXPORT_SUPPRESSION) {
        return ("CF_ENABLE_EXPORT_SUPPRESSION");
    }
    if (flags & IMAGE_GUARD_CF_LONGJUMP_TABLE_PRESENT) {
        return ("CF_LONGJUMP_TABLE_PRESENT");
    }
    if (flags & IMAGE_GUARD_RF_INSTRUMENTED) {
        return ("RF_INSTRUMENTED");
    }
    if (flags & IMAGE_GUARD_RF_ENABLE) {
        return ("RF_ENABLE");
    }
    if (flags & IMAGE_GUARD_RF_STRICT) {
        return ("RF_STRICT");
    }
    if (flags & IMAGE_GUARD_RETPOLINE_PRESENT) {
        return ("RETPOLINE_PRESENT");
    }
    return "";
}